

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O3

bool __thiscall
chaiscript::Type_Conversions::has_conversion(Type_Conversions *this,Type_Info *to,Type_Info *from)

{
  const_iterator cVar1;
  shared_lock<chaiscript::detail::threading::shared_mutex> l;
  unique_lock<chaiscript::detail::threading::shared_mutex> local_30;
  
  local_30._M_owns = false;
  local_30._M_device = &this->m_mutex;
  std::unique_lock<chaiscript::detail::threading::shared_mutex>::lock(&local_30);
  local_30._M_owns = true;
  cVar1 = find_bidir(this,to,from);
  std::unique_lock<chaiscript::detail::threading::shared_mutex>::~unique_lock(&local_30);
  return (_Rb_tree_header *)cVar1._M_node !=
         &(this->m_conversions)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool has_conversion(const Type_Info &to, const Type_Info &from) const
      {
        chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);
        return find_bidir(to, from) != m_conversions.end();
      }